

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormatSymbols::initialize(DecimalFormatSymbols *this)

{
  ushort uVar1;
  ConstChar16Ptr local_28;
  char16_t *local_20;
  
  UnicodeString::operator=((UnicodeString *)&this->field_0x8,L'.');
  uVar1 = *(ushort *)&this->field_0x50 & 0x1e;
  if ((*(ushort *)&this->field_0x50 & 1) != 0) {
    uVar1 = 2;
  }
  *(ushort *)&this->field_0x50 = uVar1;
  UnicodeString::operator=((UnicodeString *)&this->field_0x88,L';');
  UnicodeString::operator=((UnicodeString *)&this->field_0xc8,L'%');
  UnicodeString::operator=((UnicodeString *)&this->field_0x108,L'0');
  UnicodeString::operator=((UnicodeString *)&this->field_0x488,L'1');
  UnicodeString::operator=((UnicodeString *)&this->field_0x4c8,L'2');
  UnicodeString::operator=((UnicodeString *)&this->field_0x508,L'3');
  UnicodeString::operator=((UnicodeString *)&this->field_0x548,L'4');
  UnicodeString::operator=((UnicodeString *)&this->field_0x588,L'5');
  UnicodeString::operator=((UnicodeString *)&this->field_0x5c8,L'6');
  UnicodeString::operator=((UnicodeString *)&this->field_0x608,L'7');
  UnicodeString::operator=((UnicodeString *)&this->field_0x648,L'8');
  UnicodeString::operator=((UnicodeString *)&this->field_0x688,L'9');
  UnicodeString::operator=((UnicodeString *)&this->field_0x148,L'#');
  UnicodeString::operator=((UnicodeString *)&this->field_0x1c8,L'+');
  UnicodeString::operator=((UnicodeString *)&this->field_0x188,L'-');
  UnicodeString::operator=((UnicodeString *)&this->field_0x208,L'¤');
  local_28.p_ = L"¤¤";
  UnicodeString::setTo((UnicodeString *)&this->field_0x248,'\x01',&local_28,2);
  local_20 = local_28.p_;
  UnicodeString::operator=((UnicodeString *)&this->field_0x288,L'.');
  UnicodeString::operator=((UnicodeString *)&this->field_0x2c8,L'E');
  UnicodeString::operator=((UnicodeString *)&this->field_0x308,L'‰');
  UnicodeString::operator=((UnicodeString *)&this->field_0x348,L'*');
  UnicodeString::operator=((UnicodeString *)&this->field_0x388,L'∞');
  UnicodeString::operator=((UnicodeString *)&this->field_0x3c8,L'�');
  UnicodeString::operator=((UnicodeString *)&this->field_0x408,L'@');
  uVar1 = 2;
  if ((*(ushort *)&this->field_0x450 & 1) == 0) {
    uVar1 = *(ushort *)&this->field_0x450 & 0x1e;
  }
  *(ushort *)&this->field_0x450 = uVar1;
  UnicodeString::operator=((UnicodeString *)&this->field_0x6c8,L'×');
  this->fIsCustomCurrencySymbol = '\0';
  this->fIsCustomIntlCurrencySymbol = '\0';
  this->fCodePointZero = 0x30;
  return;
}

Assistant:

void
DecimalFormatSymbols::initialize() {
    /*
     * These strings used to be in static arrays, but the HP/UX aCC compiler
     * cannot initialize a static array with class constructors.
     *  markus 2000may25
     */
    fSymbols[kDecimalSeparatorSymbol] = (UChar)0x2e;    // '.' decimal separator
    fSymbols[kGroupingSeparatorSymbol].remove();        //     group (thousands) separator
    fSymbols[kPatternSeparatorSymbol] = (UChar)0x3b;    // ';' pattern separator
    fSymbols[kPercentSymbol] = (UChar)0x25;             // '%' percent sign
    fSymbols[kZeroDigitSymbol] = (UChar)0x30;           // '0' native 0 digit
    fSymbols[kOneDigitSymbol] = (UChar)0x31;            // '1' native 1 digit
    fSymbols[kTwoDigitSymbol] = (UChar)0x32;            // '2' native 2 digit
    fSymbols[kThreeDigitSymbol] = (UChar)0x33;          // '3' native 3 digit
    fSymbols[kFourDigitSymbol] = (UChar)0x34;           // '4' native 4 digit
    fSymbols[kFiveDigitSymbol] = (UChar)0x35;           // '5' native 5 digit
    fSymbols[kSixDigitSymbol] = (UChar)0x36;            // '6' native 6 digit
    fSymbols[kSevenDigitSymbol] = (UChar)0x37;          // '7' native 7 digit
    fSymbols[kEightDigitSymbol] = (UChar)0x38;          // '8' native 8 digit
    fSymbols[kNineDigitSymbol] = (UChar)0x39;           // '9' native 9 digit
    fSymbols[kDigitSymbol] = (UChar)0x23;               // '#' pattern digit
    fSymbols[kPlusSignSymbol] = (UChar)0x002b;          // '+' plus sign
    fSymbols[kMinusSignSymbol] = (UChar)0x2d;           // '-' minus sign
    fSymbols[kCurrencySymbol] = (UChar)0xa4;            // 'OX' currency symbol
    fSymbols[kIntlCurrencySymbol].setTo(TRUE, INTL_CURRENCY_SYMBOL_STR, 2);
    fSymbols[kMonetarySeparatorSymbol] = (UChar)0x2e;   // '.' monetary decimal separator
    fSymbols[kExponentialSymbol] = (UChar)0x45;         // 'E' exponential
    fSymbols[kPerMillSymbol] = (UChar)0x2030;           // '%o' per mill
    fSymbols[kPadEscapeSymbol] = (UChar)0x2a;           // '*' pad escape symbol
    fSymbols[kInfinitySymbol] = (UChar)0x221e;          // 'oo' infinite
    fSymbols[kNaNSymbol] = (UChar)0xfffd;               // SUB NaN
    fSymbols[kSignificantDigitSymbol] = (UChar)0x0040;  // '@' significant digit
    fSymbols[kMonetaryGroupingSeparatorSymbol].remove(); // 
    fSymbols[kExponentMultiplicationSymbol] = (UChar)0xd7; // 'x' multiplication symbol for exponents
    fIsCustomCurrencySymbol = FALSE; 
    fIsCustomIntlCurrencySymbol = FALSE;
    fCodePointZero = 0x30;
    U_ASSERT(fCodePointZero == fSymbols[kZeroDigitSymbol].char32At(0));

}